

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_pi_create_encode
               (opj_pi_iterator_t *pi,opj_cp_t *cp,OPJ_UINT32 tileno,OPJ_UINT32 pino,
               OPJ_UINT32 tpnum,OPJ_INT32 tppos,J2K_T2_MODE t2_mode)

{
  opj_tcp_t *poVar1;
  OPJ_BOOL OVar2;
  char *prog_00;
  bool bVar3;
  bool bVar4;
  opj_poc_t_conflict *tcp;
  opj_tcp_t *tcps;
  OPJ_UINT32 resetX;
  OPJ_UINT32 incr_top;
  OPJ_INT32 i;
  OPJ_CHAR *prog;
  OPJ_INT32 tppos_local;
  OPJ_UINT32 tpnum_local;
  OPJ_UINT32 pino_local;
  OPJ_UINT32 tileno_local;
  opj_cp_t *cp_local;
  opj_pi_iterator_t *pi_local;
  
  bVar3 = true;
  poVar1 = cp->tcps;
  prog_00 = opj_j2k_convert_progression_order(poVar1[tileno].pocs[pino].prg);
  pi[pino].first = 1;
  pi[pino].poc.prg = poVar1[tileno].pocs[pino].prg;
  if (((*(byte *)((long)&cp->m_specific_param + 0x18) & 1) == 0) ||
     (((((2 < cp->rsiz && (cp->rsiz < 7)) || ((0x3ff < cp->rsiz && (cp->rsiz < 0x99c)))) ||
       (t2_mode != FINAL_PASS)) &&
      (((cp->rsiz < 3 || (6 < cp->rsiz)) && ((cp->rsiz < 0x400 || (0x99b < cp->rsiz)))))))) {
    pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].resS;
    pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].resE;
    pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].compS;
    pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].compE;
    pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].layS;
    pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].layE;
    pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prcS;
    pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prcE;
    pi[pino].poc.tx0 = poVar1[tileno].pocs[pino].txS;
    pi[pino].poc.ty0 = poVar1[tileno].pocs[pino].tyS;
    pi[pino].poc.tx1 = poVar1[tileno].pocs[pino].txE;
    pi[pino].poc.ty1 = poVar1[tileno].pocs[pino].tyE;
  }
  else {
    for (resetX = tppos + 1; (int)resetX < 4; resetX = resetX + 1) {
      switch(prog_00[(int)resetX]) {
      case 'C':
        pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].compS;
        pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].compE;
        break;
      case 'L':
        pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].layS;
        pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].layE;
        break;
      case 'P':
        if ((uint)poVar1[tileno].pocs[pino].prg < 2) {
          pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prcS;
          pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prcE;
        }
        else {
          pi[pino].poc.tx0 = poVar1[tileno].pocs[pino].txS;
          pi[pino].poc.ty0 = poVar1[tileno].pocs[pino].tyS;
          pi[pino].poc.tx1 = poVar1[tileno].pocs[pino].txE;
          pi[pino].poc.ty1 = poVar1[tileno].pocs[pino].tyE;
        }
        break;
      case 'R':
        pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].resS;
        pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].resE;
      }
    }
    resetX = tppos;
    if (tpnum == 0) {
      for (; -1 < (int)resetX; resetX = resetX - 1) {
        switch(prog_00[(int)resetX]) {
        case 'C':
          poVar1[tileno].pocs[pino].comp_t = poVar1[tileno].pocs[pino].compS;
          pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].comp_t;
          pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].comp_t + 1;
          poVar1[tileno].pocs[pino].comp_t = poVar1[tileno].pocs[pino].comp_t + 1;
          break;
        case 'L':
          poVar1[tileno].pocs[pino].lay_t = poVar1[tileno].pocs[pino].layS;
          pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].lay_t;
          pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].lay_t + 1;
          poVar1[tileno].pocs[pino].lay_t = poVar1[tileno].pocs[pino].lay_t + 1;
          break;
        case 'P':
          if ((uint)poVar1[tileno].pocs[pino].prg < 2) {
            poVar1[tileno].pocs[pino].prc_t = poVar1[tileno].pocs[pino].prcS;
            pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prc_t;
            pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prc_t + 1;
            poVar1[tileno].pocs[pino].prc_t = poVar1[tileno].pocs[pino].prc_t + 1;
          }
          else {
            poVar1[tileno].pocs[pino].tx0_t = poVar1[tileno].pocs[pino].txS;
            poVar1[tileno].pocs[pino].ty0_t = poVar1[tileno].pocs[pino].tyS;
            pi[pino].poc.tx0 = poVar1[tileno].pocs[pino].tx0_t;
            pi[pino].poc.tx1 =
                 (poVar1[tileno].pocs[pino].tx0_t + poVar1[tileno].pocs[pino].dx) -
                 poVar1[tileno].pocs[pino].tx0_t % poVar1[tileno].pocs[pino].dx;
            pi[pino].poc.ty0 = poVar1[tileno].pocs[pino].ty0_t;
            pi[pino].poc.ty1 =
                 (poVar1[tileno].pocs[pino].ty0_t + poVar1[tileno].pocs[pino].dy) -
                 poVar1[tileno].pocs[pino].ty0_t % poVar1[tileno].pocs[pino].dy;
            poVar1[tileno].pocs[pino].tx0_t = pi[pino].poc.tx1;
            poVar1[tileno].pocs[pino].ty0_t = pi[pino].poc.ty1;
          }
          break;
        case 'R':
          poVar1[tileno].pocs[pino].res_t = poVar1[tileno].pocs[pino].resS;
          pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].res_t;
          pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].res_t + 1;
          poVar1[tileno].pocs[pino].res_t = poVar1[tileno].pocs[pino].res_t + 1;
        }
      }
    }
    else {
      for (; -1 < (int)resetX; resetX = resetX - 1) {
        switch(prog_00[(int)resetX]) {
        case 'C':
          pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].comp_t - 1;
          pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].comp_t;
          break;
        case 'L':
          pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].lay_t - 1;
          pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].lay_t;
          break;
        case 'P':
          if ((uint)poVar1[tileno].pocs[pino].prg < 2) {
            pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prc_t - 1;
            pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prc_t;
          }
          else {
            pi[pino].poc.tx0 =
                 (poVar1[tileno].pocs[pino].tx0_t - poVar1[tileno].pocs[pino].dx) -
                 poVar1[tileno].pocs[pino].tx0_t % poVar1[tileno].pocs[pino].dx;
            pi[pino].poc.tx1 = poVar1[tileno].pocs[pino].tx0_t;
            pi[pino].poc.ty0 =
                 (poVar1[tileno].pocs[pino].ty0_t - poVar1[tileno].pocs[pino].dy) -
                 poVar1[tileno].pocs[pino].ty0_t % poVar1[tileno].pocs[pino].dy;
            pi[pino].poc.ty1 = poVar1[tileno].pocs[pino].ty0_t;
          }
          break;
        case 'R':
          pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].res_t - 1;
          pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].res_t;
        }
        if (bVar3) {
          switch(prog_00[(int)resetX]) {
          case 'C':
            if (poVar1[tileno].pocs[pino].comp_t == poVar1[tileno].pocs[pino].compE) {
              OVar2 = opj_pi_check_next_level(resetX - 1,cp,tileno,pino,prog_00);
              bVar3 = OVar2 != 0;
              if (bVar3) {
                poVar1[tileno].pocs[pino].comp_t = poVar1[tileno].pocs[pino].compS;
                pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].comp_t;
                pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].comp_t + 1;
                poVar1[tileno].pocs[pino].comp_t = poVar1[tileno].pocs[pino].comp_t + 1;
              }
            }
            else {
              pi[pino].poc.compno0 = poVar1[tileno].pocs[pino].comp_t;
              pi[pino].poc.compno1 = poVar1[tileno].pocs[pino].comp_t + 1;
              poVar1[tileno].pocs[pino].comp_t = poVar1[tileno].pocs[pino].comp_t + 1;
              bVar3 = false;
            }
            break;
          case 'L':
            if (poVar1[tileno].pocs[pino].lay_t == poVar1[tileno].pocs[pino].layE) {
              OVar2 = opj_pi_check_next_level(resetX - 1,cp,tileno,pino,prog_00);
              bVar3 = OVar2 != 0;
              if (bVar3) {
                poVar1[tileno].pocs[pino].lay_t = poVar1[tileno].pocs[pino].layS;
                pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].lay_t;
                pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].lay_t + 1;
                poVar1[tileno].pocs[pino].lay_t = poVar1[tileno].pocs[pino].lay_t + 1;
              }
            }
            else {
              pi[pino].poc.layno0 = poVar1[tileno].pocs[pino].lay_t;
              pi[pino].poc.layno1 = poVar1[tileno].pocs[pino].lay_t + 1;
              poVar1[tileno].pocs[pino].lay_t = poVar1[tileno].pocs[pino].lay_t + 1;
              bVar3 = false;
            }
            break;
          case 'P':
            if ((uint)poVar1[tileno].pocs[pino].prg < 2) {
              if (poVar1[tileno].pocs[pino].prc_t == poVar1[tileno].pocs[pino].prcE) {
                OVar2 = opj_pi_check_next_level(resetX - 1,cp,tileno,pino,prog_00);
                bVar3 = OVar2 != 0;
                if (bVar3) {
                  poVar1[tileno].pocs[pino].prc_t = poVar1[tileno].pocs[pino].prcS;
                  pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prc_t;
                  pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prc_t + 1;
                  poVar1[tileno].pocs[pino].prc_t = poVar1[tileno].pocs[pino].prc_t + 1;
                }
              }
              else {
                pi[pino].poc.precno0 = poVar1[tileno].pocs[pino].prc_t;
                pi[pino].poc.precno1 = poVar1[tileno].pocs[pino].prc_t + 1;
                poVar1[tileno].pocs[pino].prc_t = poVar1[tileno].pocs[pino].prc_t + 1;
                bVar3 = false;
              }
            }
            else if (poVar1[tileno].pocs[pino].tx0_t < poVar1[tileno].pocs[pino].txE) {
              pi[pino].poc.tx0 = poVar1[tileno].pocs[pino].tx0_t;
              pi[pino].poc.tx1 =
                   (poVar1[tileno].pocs[pino].tx0_t + poVar1[tileno].pocs[pino].dx) -
                   poVar1[tileno].pocs[pino].tx0_t % poVar1[tileno].pocs[pino].dx;
              poVar1[tileno].pocs[pino].tx0_t = pi[pino].poc.tx1;
              bVar3 = false;
            }
            else {
              if (poVar1[tileno].pocs[pino].ty0_t < poVar1[tileno].pocs[pino].tyE) {
                pi[pino].poc.ty0 = poVar1[tileno].pocs[pino].ty0_t;
                pi[pino].poc.ty1 =
                     (poVar1[tileno].pocs[pino].ty0_t + poVar1[tileno].pocs[pino].dy) -
                     poVar1[tileno].pocs[pino].ty0_t % poVar1[tileno].pocs[pino].dy;
                poVar1[tileno].pocs[pino].ty0_t = pi[pino].poc.ty1;
                bVar4 = true;
                bVar3 = false;
              }
              else {
                OVar2 = opj_pi_check_next_level(resetX - 1,cp,tileno,pino,prog_00);
                bVar4 = OVar2 != 0;
                bVar3 = bVar4;
                if (bVar4) {
                  poVar1[tileno].pocs[pino].ty0_t = poVar1[tileno].pocs[pino].tyS;
                  pi[pino].poc.ty0 = poVar1[tileno].pocs[pino].ty0_t;
                  pi[pino].poc.ty1 =
                       (poVar1[tileno].pocs[pino].ty0_t + poVar1[tileno].pocs[pino].dy) -
                       poVar1[tileno].pocs[pino].ty0_t % poVar1[tileno].pocs[pino].dy;
                  poVar1[tileno].pocs[pino].ty0_t = pi[pino].poc.ty1;
                }
              }
              if (bVar4) {
                poVar1[tileno].pocs[pino].tx0_t = poVar1[tileno].pocs[pino].txS;
                pi[pino].poc.tx0 = poVar1[tileno].pocs[pino].tx0_t;
                pi[pino].poc.tx1 =
                     (poVar1[tileno].pocs[pino].tx0_t + poVar1[tileno].pocs[pino].dx) -
                     poVar1[tileno].pocs[pino].tx0_t % poVar1[tileno].pocs[pino].dx;
                poVar1[tileno].pocs[pino].tx0_t = pi[pino].poc.tx1;
              }
            }
            break;
          case 'R':
            if (poVar1[tileno].pocs[pino].res_t == poVar1[tileno].pocs[pino].resE) {
              OVar2 = opj_pi_check_next_level(resetX - 1,cp,tileno,pino,prog_00);
              bVar3 = OVar2 != 0;
              if (bVar3) {
                poVar1[tileno].pocs[pino].res_t = poVar1[tileno].pocs[pino].resS;
                pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].res_t;
                pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].res_t + 1;
                poVar1[tileno].pocs[pino].res_t = poVar1[tileno].pocs[pino].res_t + 1;
              }
            }
            else {
              pi[pino].poc.resno0 = poVar1[tileno].pocs[pino].res_t;
              pi[pino].poc.resno1 = poVar1[tileno].pocs[pino].res_t + 1;
              poVar1[tileno].pocs[pino].res_t = poVar1[tileno].pocs[pino].res_t + 1;
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void opj_pi_create_encode(opj_pi_iterator_t *pi,
                          opj_cp_t *cp,
                          OPJ_UINT32 tileno,
                          OPJ_UINT32 pino,
                          OPJ_UINT32 tpnum,
                          OPJ_INT32 tppos,
                          J2K_T2_MODE t2_mode)
{
    const OPJ_CHAR *prog;
    OPJ_INT32 i;
    OPJ_UINT32 incr_top = 1, resetX = 0;
    opj_tcp_t *tcps = &cp->tcps[tileno];
    opj_poc_t *tcp = &tcps->pocs[pino];

    prog = opj_j2k_convert_progression_order(tcp->prg);

    pi[pino].first = 1;
    pi[pino].poc.prg = tcp->prg;

    if (!(cp->m_specific_param.m_enc.m_tp_on && ((!OPJ_IS_CINEMA(cp->rsiz) &&
            !OPJ_IS_IMF(cp->rsiz) &&
            (t2_mode == FINAL_PASS)) || OPJ_IS_CINEMA(cp->rsiz) || OPJ_IS_IMF(cp->rsiz)))) {
        pi[pino].poc.resno0 = tcp->resS;
        pi[pino].poc.resno1 = tcp->resE;
        pi[pino].poc.compno0 = tcp->compS;
        pi[pino].poc.compno1 = tcp->compE;
        pi[pino].poc.layno0 = tcp->layS;
        pi[pino].poc.layno1 = tcp->layE;
        pi[pino].poc.precno0 = tcp->prcS;
        pi[pino].poc.precno1 = tcp->prcE;
        pi[pino].poc.tx0 = tcp->txS;
        pi[pino].poc.ty0 = tcp->tyS;
        pi[pino].poc.tx1 = tcp->txE;
        pi[pino].poc.ty1 = tcp->tyE;
    } else {
        for (i = tppos + 1; i < 4; i++) {
            switch (prog[i]) {
            case 'R':
                pi[pino].poc.resno0 = tcp->resS;
                pi[pino].poc.resno1 = tcp->resE;
                break;
            case 'C':
                pi[pino].poc.compno0 = tcp->compS;
                pi[pino].poc.compno1 = tcp->compE;
                break;
            case 'L':
                pi[pino].poc.layno0 = tcp->layS;
                pi[pino].poc.layno1 = tcp->layE;
                break;
            case 'P':
                switch (tcp->prg) {
                case OPJ_LRCP:
                case OPJ_RLCP:
                    pi[pino].poc.precno0 = tcp->prcS;
                    pi[pino].poc.precno1 = tcp->prcE;
                    break;
                default:
                    pi[pino].poc.tx0 = tcp->txS;
                    pi[pino].poc.ty0 = tcp->tyS;
                    pi[pino].poc.tx1 = tcp->txE;
                    pi[pino].poc.ty1 = tcp->tyE;
                    break;
                }
                break;
            }
        }

        if (tpnum == 0) {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    tcp->comp_t = tcp->compS;
                    pi[pino].poc.compno0 = tcp->comp_t;
                    pi[pino].poc.compno1 = tcp->comp_t + 1;
                    tcp->comp_t += 1;
                    break;
                case 'R':
                    tcp->res_t = tcp->resS;
                    pi[pino].poc.resno0 = tcp->res_t;
                    pi[pino].poc.resno1 = tcp->res_t + 1;
                    tcp->res_t += 1;
                    break;
                case 'L':
                    tcp->lay_t = tcp->layS;
                    pi[pino].poc.layno0 = tcp->lay_t;
                    pi[pino].poc.layno1 = tcp->lay_t + 1;
                    tcp->lay_t += 1;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        tcp->prc_t = tcp->prcS;
                        pi[pino].poc.precno0 = tcp->prc_t;
                        pi[pino].poc.precno1 = tcp->prc_t + 1;
                        tcp->prc_t += 1;
                        break;
                    default:
                        tcp->tx0_t = tcp->txS;
                        tcp->ty0_t = tcp->tyS;
                        pi[pino].poc.tx0 = tcp->tx0_t;
                        pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.ty0 = tcp->ty0_t;
                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                        tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                        break;
                    }
                    break;
                }
            }
            incr_top = 1;
        } else {
            for (i = tppos; i >= 0; i--) {
                switch (prog[i]) {
                case 'C':
                    pi[pino].poc.compno0 = tcp->comp_t - 1;
                    pi[pino].poc.compno1 = tcp->comp_t;
                    break;
                case 'R':
                    pi[pino].poc.resno0 = tcp->res_t - 1;
                    pi[pino].poc.resno1 = tcp->res_t;
                    break;
                case 'L':
                    pi[pino].poc.layno0 = tcp->lay_t - 1;
                    pi[pino].poc.layno1 = tcp->lay_t;
                    break;
                case 'P':
                    switch (tcp->prg) {
                    case OPJ_LRCP:
                    case OPJ_RLCP:
                        pi[pino].poc.precno0 = tcp->prc_t - 1;
                        pi[pino].poc.precno1 = tcp->prc_t;
                        break;
                    default:
                        pi[pino].poc.tx0 = tcp->tx0_t - tcp->dx - (tcp->tx0_t % tcp->dx);
                        pi[pino].poc.tx1 = tcp->tx0_t ;
                        pi[pino].poc.ty0 = tcp->ty0_t - tcp->dy - (tcp->ty0_t % tcp->dy);
                        pi[pino].poc.ty1 = tcp->ty0_t ;
                        break;
                    }
                    break;
                }
                if (incr_top == 1) {
                    switch (prog[i]) {
                    case 'R':
                        if (tcp->res_t == tcp->resE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->res_t = tcp->resS;
                                pi[pino].poc.resno0 = tcp->res_t;
                                pi[pino].poc.resno1 = tcp->res_t + 1;
                                tcp->res_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.resno0 = tcp->res_t;
                            pi[pino].poc.resno1 = tcp->res_t + 1;
                            tcp->res_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'C':
                        if (tcp->comp_t == tcp->compE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->comp_t = tcp->compS;
                                pi[pino].poc.compno0 = tcp->comp_t;
                                pi[pino].poc.compno1 = tcp->comp_t + 1;
                                tcp->comp_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.compno0 = tcp->comp_t;
                            pi[pino].poc.compno1 = tcp->comp_t + 1;
                            tcp->comp_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'L':
                        if (tcp->lay_t == tcp->layE) {
                            if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                tcp->lay_t = tcp->layS;
                                pi[pino].poc.layno0 = tcp->lay_t;
                                pi[pino].poc.layno1 = tcp->lay_t + 1;
                                tcp->lay_t += 1;
                                incr_top = 1;
                            } else {
                                incr_top = 0;
                            }
                        } else {
                            pi[pino].poc.layno0 = tcp->lay_t;
                            pi[pino].poc.layno1 = tcp->lay_t + 1;
                            tcp->lay_t += 1;
                            incr_top = 0;
                        }
                        break;
                    case 'P':
                        switch (tcp->prg) {
                        case OPJ_LRCP:
                        case OPJ_RLCP:
                            if (tcp->prc_t == tcp->prcE) {
                                if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                    tcp->prc_t = tcp->prcS;
                                    pi[pino].poc.precno0 = tcp->prc_t;
                                    pi[pino].poc.precno1 = tcp->prc_t + 1;
                                    tcp->prc_t += 1;
                                    incr_top = 1;
                                } else {
                                    incr_top = 0;
                                }
                            } else {
                                pi[pino].poc.precno0 = tcp->prc_t;
                                pi[pino].poc.precno1 = tcp->prc_t + 1;
                                tcp->prc_t += 1;
                                incr_top = 0;
                            }
                            break;
                        default:
                            if (tcp->tx0_t >= tcp->txE) {
                                if (tcp->ty0_t >= tcp->tyE) {
                                    if (opj_pi_check_next_level(i - 1, cp, tileno, pino, prog)) {
                                        tcp->ty0_t = tcp->tyS;
                                        pi[pino].poc.ty0 = tcp->ty0_t;
                                        pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                        tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                        incr_top = 1;
                                        resetX = 1;
                                    } else {
                                        incr_top = 0;
                                        resetX = 0;
                                    }
                                } else {
                                    pi[pino].poc.ty0 = tcp->ty0_t;
                                    pi[pino].poc.ty1 = tcp->ty0_t + tcp->dy - (tcp->ty0_t % tcp->dy);
                                    tcp->ty0_t = (OPJ_UINT32)pi[pino].poc.ty1;
                                    incr_top = 0;
                                    resetX = 1;
                                }
                                if (resetX == 1) {
                                    tcp->tx0_t = tcp->txS;
                                    pi[pino].poc.tx0 = tcp->tx0_t;
                                    pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                    tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                }
                            } else {
                                pi[pino].poc.tx0 = tcp->tx0_t;
                                pi[pino].poc.tx1 = tcp->tx0_t + tcp->dx - (tcp->tx0_t % tcp->dx);
                                tcp->tx0_t = (OPJ_UINT32)pi[pino].poc.tx1;
                                incr_top = 0;
                            }
                            break;
                        }
                        break;
                    }
                }
            }
        }
    }
}